

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

_Bool golf_script_load(golf_script_t *script,char *path,char *data,int data_len)

{
  uint *value;
  gs_parser_t *parser;
  int *piVar1;
  int *capacity;
  vec_gs_env_t *data_00;
  byte bVar2;
  gs_env_t **ppgVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  map_base_t *m;
  gs_stmt_t *stmt;
  uint uVar10;
  long lVar11;
  long lVar12;
  gs_token_type gVar13;
  gs_token_t *pgVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  gs_token_t token;
  int local_a4;
  char *local_60;
  gs_val_t local_58;
  long local_40;
  char **local_38;
  
  iVar6 = vec_expand_((char **)&_gs_store,&_gs_store.scripts.length,&_gs_store.scripts.capacity,8,
                      _gs_store.scripts.alloc_category);
  if (iVar6 == 0) {
    lVar11 = (long)_gs_store.scripts.length;
    _gs_store.scripts.length = _gs_store.scripts.length + 1;
    _gs_store.scripts.data[lVar11] = script;
  }
  iVar20 = 0;
  snprintf(script->path,0x400,"%s",path);
  local_38 = &script->error;
  parser = &script->parser;
  script->error = (char *)0x0;
  (script->parser).tokens.data = (gs_token_t *)0x0;
  (script->parser).tokens.length = 0;
  (script->parser).tokens.capacity = 0;
  (script->parser).tokens.alloc_category = "script/parser";
  (script->parser).cur_token = 0;
  (script->parser).error = false;
  (script->parser).allocated_memory.data = (void **)0x0;
  (script->parser).allocated_memory.length = 0;
  (script->parser).allocated_memory.capacity = 0;
  (script->parser).allocated_memory.alloc_category = "script/parser";
  piVar1 = &(script->parser).tokens.length;
  capacity = &(script->parser).tokens.capacity;
  iVar6 = 0x23dc3a;
  local_60 = "script/parser";
  local_a4 = 1;
  iVar19 = 1;
LAB_00136bf7:
  lVar11 = (long)iVar20;
  pcVar17 = data + lVar11;
  bVar2 = data[lVar11];
  if (bVar2 == 0x2f) {
    if (pcVar17[1] == '/') {
      cVar5 = '/';
      pcVar17 = data + lVar11 + 1;
      while ((cVar5 != '\0' && (cVar5 != '\n'))) {
        iVar20 = iVar20 + 1;
        cVar5 = *pcVar17;
        pcVar17 = pcVar17 + 1;
      }
      goto LAB_00136bf7;
    }
LAB_00136c59:
    if ((bVar2 != 0x5f) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
      if ((byte)(bVar2 - 0x30) < 10) {
        iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                            (script->parser).tokens.alloc_category);
        if (iVar7 == 0) {
          pgVar14 = (parser->tokens).data;
          iVar7 = *piVar1;
          *piVar1 = iVar7 + 1;
          cVar5 = *pcVar17;
          local_60 = (char *)(ulong)(cVar5 == '-');
          fVar21 = 0.0;
          fVar18 = 0.0;
          bVar4 = false;
          fVar22 = 10.0;
          do {
            uVar10 = (uint)(byte)pcVar17[(long)local_60];
            if ((byte)(pcVar17[(long)local_60] - 0x30U) < 10) {
              if (bVar4) {
                fVar21 = fVar21 + (float)(int)(uVar10 - 0x30) / fVar22;
                fVar22 = fVar22 * 10.0;
              }
              else {
                fVar18 = (float)(uVar10 + (int)fVar18 * 10 + -0x30);
              }
            }
            else {
              if (uVar10 != 0x2e) goto LAB_00136ee5;
              bVar4 = true;
            }
            local_60 = local_60 + 1;
          } while( true );
        }
        goto LAB_00136f34;
      }
      uVar10 = bVar2 - 0x22;
      if (uVar10 < 0x3c) {
        if ((0xa0000001e003fc0U >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
          if ((ulong)uVar10 != 0) goto LAB_00136fd2;
          iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                              (script->parser).tokens.alloc_category);
          if (iVar7 == 0) {
            pgVar14 = (parser->tokens).data + *piVar1;
            *piVar1 = *piVar1 + 1;
            uVar10 = 1;
            lVar16 = 0x100000000;
            for (uVar15 = 1; (pcVar17[uVar15] != '\0' && (pcVar17[uVar15] != '\"'));
                uVar15 = uVar15 + 1) {
              lVar16 = lVar16 + 0x100000000;
              uVar10 = uVar10 + 1;
            }
            pcVar9 = (char *)golf_alloc_tracked(uVar15 & 0xffffffff,"script/parser");
            lVar12 = 1;
            if (1 < uVar15) {
              if ((int)uVar10 < 3) {
                uVar10 = 2;
              }
              lVar12 = 0;
              do {
                pcVar9[lVar12] = data[lVar12 + lVar11 + 1];
                lVar12 = lVar12 + 1;
              } while ((ulong)uVar10 - 1 != lVar12);
              lVar12 = lVar16 >> 0x20;
            }
            pcVar9[lVar12 + -1] = '\0';
            iVar6 = (int)uVar15 + (uint)(pcVar17[lVar12] == '\"');
            pgVar14->type = GS_TOKEN_STRING;
            pgVar14->line = local_a4;
            pgVar14->col = iVar19;
            (pgVar14->field_3).symbol = pcVar9;
          }
          iVar20 = iVar20 + iVar6;
          iVar19 = iVar19 + iVar6;
          goto LAB_00136bf7;
        }
      }
      else {
LAB_00136fd2:
        if ((bVar2 != 0x7b) && (bVar2 != 0x7d)) {
          local_58.type = GS_VAL_FLOAT;
          local_58._4_4_ = local_a4;
          local_58.field_2.int_val = iVar19;
          local_58.field_2.field10[8] = bVar2;
          gs_parser_error(parser,0x23dce5);
          goto LAB_001370da;
        }
      }
      iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                          (script->parser).tokens.alloc_category);
      if (iVar7 == 0) {
        pgVar14 = (parser->tokens).data;
        iVar7 = *piVar1;
        *piVar1 = iVar7 + 1;
        cVar5 = *pcVar17;
        pgVar14[iVar7].type = GS_TOKEN_CHAR;
        pgVar14[iVar7].line = local_a4;
        pgVar14[iVar7].col = iVar19;
        pgVar14[iVar7].field_3.c = cVar5;
      }
      iVar19 = iVar19 + 1;
      iVar20 = iVar20 + 1;
      goto LAB_00136bf7;
    }
    iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,(script->parser).tokens.alloc_category)
    ;
    lVar11 = 0;
    if (iVar7 == 0) {
      pgVar14 = (parser->tokens).data;
      local_40 = (long)*piVar1;
      *piVar1 = *piVar1 + 1;
      lVar16 = -0x100000000;
      lVar11 = -1;
      uVar10 = 0;
      do {
        do {
          uVar8 = uVar10;
          lVar12 = lVar11;
          bVar2 = pcVar17[lVar12 + 1];
          lVar11 = lVar12 + 1;
          lVar16 = lVar16 + 0x100000000;
          uVar10 = uVar8 + 1;
        } while (bVar2 == 0x5f);
      } while (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a));
      pcVar9 = (char *)golf_alloc_tracked((ulong)((int)lVar12 + 2),"script/parser");
      if (0 < lVar11) {
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
        uVar15 = 0;
        do {
          pcVar9[uVar15] = pcVar17[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
      pgVar14 = pgVar14 + local_40;
      pcVar9[lVar16 >> 0x20] = '\0';
      pgVar14->type = GS_TOKEN_SYMBOL;
      pgVar14->line = local_a4;
      pgVar14->col = iVar19;
      (pgVar14->field_3).symbol = pcVar9;
    }
    iVar20 = iVar20 + (int)lVar11;
    iVar19 = iVar19 + (int)lVar11;
    goto LAB_00136bf7;
  }
  if (9 < bVar2) {
    if (bVar2 == 10) {
      local_a4 = local_a4 + 1;
      iVar20 = iVar20 + 1;
      iVar19 = 1;
    }
    else {
      if ((bVar2 != 0x20) && (bVar2 != 0xd)) goto LAB_00136c59;
LAB_00136c44:
      iVar19 = iVar19 + 1;
      iVar20 = iVar20 + 1;
    }
    goto LAB_00136bf7;
  }
  if (bVar2 != 0) {
    if (bVar2 == 9) goto LAB_00136c44;
    goto LAB_00136c59;
  }
  iVar6 = vec_expand_((char **)parser,piVar1,capacity,0x18,(script->parser).tokens.alloc_category);
  if (iVar6 == 0) {
    pgVar14 = (parser->tokens).data;
    iVar6 = *piVar1;
    *piVar1 = iVar6 + 1;
    pgVar14[iVar6].type = GS_TOKEN_EOF;
    pgVar14[iVar6].line = local_a4;
    pgVar14[iVar6].col = iVar19;
  }
LAB_001370da:
  if ((script->parser).error == true) {
LAB_001370e3:
    script->error = (script->parser).error_string;
  }
  else {
    m = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
    m[1].buckets = (map_node_t **)0x0;
    m[1].nbuckets = 0;
    m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)0x0;
    m[2].nbuckets = 0;
    m[2].nnodes = 0;
    m->buckets = (map_node_t **)0x0;
    m->nbuckets = 0;
    m->nnodes = 0;
    m[3].buckets = (map_node_t **)"script/eval";
    value = &m[1].nbuckets;
    m[1].nbuckets = 3;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined4 *)&m[2].buckets = 0x40490fdb;
    map_set_(m,"PI",value,0x18,"script/eval");
    m[1].nbuckets = 1;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined1 *)&m[2].buckets = 1;
    map_set_(m,"true",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 1;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined1 *)&m[2].buckets = 0;
    map_set_(m,"false",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_print;
    map_set_(m,"print",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_V2;
    map_set_(m,"V2",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_V3;
    map_set_(m,"V3",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec2_bezier4;
    map_set_(m,"vec2_bezier4",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_distance;
    map_set_(m,"vec3_distance",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_length;
    map_set_(m,"vec3_length",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_normalize;
    map_set_(m,"vec3_normalize",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_cos;
    map_set_(m,"cos",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_sin;
    map_set_(m,"sin",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_acos;
    map_set_(m,"acos",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_asin;
    map_set_(m,"asin",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_sqrt;
    map_set_(m,"sqrt",value,0x18,(char *)m[3].buckets);
    data_00 = &(script->eval).env;
    (script->eval).env.data = (gs_env_t **)0x0;
    (script->eval).env.length = 0;
    (script->eval).env.capacity = 0;
    (script->eval).env.alloc_category = "script/eval";
    piVar1 = &(script->eval).env.length;
    iVar6 = vec_expand_((char **)data_00,piVar1,&(script->eval).env.capacity,8,"script/eval");
    if (iVar6 == 0) {
      ppgVar3 = data_00->data;
      iVar6 = *piVar1;
      *piVar1 = iVar6 + 1;
      ppgVar3[iVar6] = (gs_env_t *)m;
    }
    (script->eval).allocated_strings.data = (void **)0x0;
    (script->eval).allocated_strings.length = 0;
    (script->eval).allocated_strings.capacity = 0;
    (script->eval).allocated_strings.alloc_category = "script/eval";
    (script->eval).allocated_lists.data = (void **)0x0;
    (script->eval).allocated_lists.length = 0;
    (script->eval).allocated_lists.capacity = 0;
    (script->eval).allocated_lists.alloc_category = "script/eval";
    if ((script->parser).tokens.data[(script->parser).cur_token].type != GS_TOKEN_EOF) {
      do {
        stmt = gs_parse_stmt(parser);
        if ((script->parser).error == true) goto LAB_001370e3;
        gs_eval_stmt(&local_58,&script->eval,stmt);
        if (local_58.type == GS_VAL_ERROR) {
          *local_38 = (char *)CONCAT44(local_58.field_2.vec2_val.y,local_58.field_2.int_val);
          return true;
        }
      } while ((script->parser).tokens.data[(script->parser).cur_token].type != GS_TOKEN_EOF);
    }
  }
  return true;
LAB_00136ee5:
  if (bVar4) {
    fVar21 = fVar21 + (float)(int)fVar18;
    if (cVar5 == '-') {
      fVar21 = -fVar21;
    }
    gVar13 = GS_TOKEN_FLOAT;
  }
  else {
    fVar21 = (float)-(int)fVar18;
    if (cVar5 != '-') {
      fVar21 = fVar18;
    }
    gVar13 = GS_TOKEN_INT;
  }
  pgVar14 = pgVar14 + iVar7;
  pgVar14->type = gVar13;
  pgVar14->line = local_a4;
  pgVar14->col = iVar19;
  (pgVar14->field_3).float_val = fVar21;
LAB_00136f34:
  iVar20 = iVar20 + (int)local_60;
  iVar19 = iVar19 + (int)local_60;
  goto LAB_00136bf7;
}

Assistant:

bool golf_script_load(golf_script_t *script, const char *path, const char *data, int data_len) {
    GOLF_UNUSED(data_len);

    vec_push(&_gs_store.scripts, script);

    snprintf(script->path, GOLF_FILE_MAX_PATH, "%s", path);
    script->error = NULL;
    vec_init(&script->parser.tokens, "script/parser");
    script->parser.cur_token = 0;
    script->parser.error = false;
    vec_init(&script->parser.allocated_memory, "script/parser");

    gs_tokenize(&script->parser, data);
    if (script->parser.error) {
        script->error = script->parser.error_string;
        return true;
    }
    if (false) {
        gs_debug_print_tokens(&script->parser.tokens);
    }

    gs_env_t *global_env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&global_env->val_map, "script/eval");
    map_set(&global_env->val_map, "PI", gs_val_float(MF_PI));
    map_set(&global_env->val_map, "true", gs_val_bool(true));
    map_set(&global_env->val_map, "false", gs_val_bool(false));
    map_set(&global_env->val_map, "print", gs_val_c_fn(gs_c_fn_print));
    map_set(&global_env->val_map, "V2", gs_val_c_fn(gs_c_fn_V2));
    map_set(&global_env->val_map, "V3", gs_val_c_fn(gs_c_fn_V3));
    map_set(&global_env->val_map, "vec2_bezier4", gs_val_c_fn(gs_c_fn_vec2_bezier4));
    map_set(&global_env->val_map, "vec3_distance", gs_val_c_fn(gs_c_fn_vec3_distance));
    map_set(&global_env->val_map, "vec3_length", gs_val_c_fn(gs_c_fn_vec3_length));
    map_set(&global_env->val_map, "vec3_normalize", gs_val_c_fn(gs_c_fn_vec3_normalize));
    map_set(&global_env->val_map, "cos", gs_val_c_fn(gs_c_fn_cos));
    map_set(&global_env->val_map, "sin", gs_val_c_fn(gs_c_fn_sin));
    map_set(&global_env->val_map, "acos", gs_val_c_fn(gs_c_fn_acos));
    map_set(&global_env->val_map, "asin", gs_val_c_fn(gs_c_fn_asin));
    map_set(&global_env->val_map, "sqrt", gs_val_c_fn(gs_c_fn_sqrt));
    //map_set(&global_env->val_map, "terrain_model_add_point", gs_val_c_fn(gs_c_fn_terrain_model_add_point));
    //map_set(&global_env->val_map, "terrain_model_add_face", gs_val_c_fn(gs_c_fn_terrain_model_add_face));

    vec_init(&script->eval.env, "script/eval");
    vec_push(&script->eval.env, global_env);
    vec_init(&script->eval.allocated_strings, "script/eval");
    vec_init(&script->eval.allocated_lists, "script/eval");

    while (!gs_peek_eof(&script->parser)) {
        gs_stmt_t *stmt = gs_parse_stmt(&script->parser);
        if (script->parser.error) {
            script->error = script->parser.error_string;
            return true;
        }

        gs_val_t val = gs_eval_stmt(&script->eval, stmt);
        if (val.type == GS_VAL_ERROR) {
            script->error = val.error_val;
            return true;
        }
        if (false) {
            gs_debug_print_stmt(stmt, 0);
            gs_debug_print_val(val);
            printf("\n");
        }
    }

    return true;
}